

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

bool __thiscall
QSslConfiguration::addCaCertificates
          (QSslConfiguration *this,QString *path,EncodingFormat format,PatternSyntax syntax)

{
  qsizetype qVar1;
  QSslConfigurationPrivate *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QSslCertificate *)&DAT_aaaaaaaaaaaaaaaa;
  QSslCertificate::fromPath((QList<QSslCertificate> *)&local_38,path,format,syntax);
  qVar1 = local_38.size;
  if ((undefined1 *)local_38.size != (undefined1 *)0x0) {
    pQVar2 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
    QList<QSslCertificate>::append(&pQVar2->caCertificates,(QList<QSslCertificate> *)&local_38);
  }
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (undefined1 *)qVar1 != (undefined1 *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslConfiguration::addCaCertificates(const QString &path, QSsl::EncodingFormat format,
                                          QSslCertificate::PatternSyntax syntax)
{
    QList<QSslCertificate> certs = QSslCertificate::fromPath(path, format, syntax);
    if (certs.isEmpty())
        return false;

    d->caCertificates += certs;
    return true;
}